

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::core::Privkey::CreateTweakMul(Privkey *__return_storage_ptr__,Privkey *this,ByteData256 *tweak)

{
  undefined1 local_38 [8];
  ByteData tweak_muled;
  ByteData256 *tweak_local;
  Privkey *this_local;
  
  tweak_muled.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tweak;
  WallyUtil::MulTweakPrivkey((ByteData *)local_38,&this->data_,tweak);
  Privkey(__return_storage_ptr__,(ByteData *)local_38,kMainnet,true);
  ByteData::~ByteData((ByteData *)0x451dd3);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::CreateTweakMul(const ByteData256 &tweak) const {
  ByteData tweak_muled = WallyUtil::MulTweakPrivkey(data_, tweak);
  return Privkey(tweak_muled);
}